

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_callback<bool>
          (Parser *this,string *name,string *alternative,
          function<bool_(cli::CallbackArgs_&)> *callback,string *description,bool dominant)

{
  CmdFunction<bool> *this_00;
  CmdFunction<bool> *local_58 [3];
  CmdFunction<bool> *local_40;
  CmdFunction<bool> *command;
  string *psStack_30;
  bool dominant_local;
  string *description_local;
  function<bool_(cli::CallbackArgs_&)> *callback_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command._7_1_ = dominant;
  psStack_30 = description;
  description_local = (string *)callback;
  callback_local = (function<bool_(cli::CallbackArgs_&)> *)alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdFunction<bool> *)operator_new(0xd8);
  CmdFunction<bool>::CmdFunction
            (this_00,alternative_local,(string *)callback_local,psStack_30,false,
             (bool)(command._7_1_ & 1));
  local_40 = this_00;
  std::function<bool_(cli::CallbackArgs_&)>::operator=(&this_00->callback,callback);
  local_58[0] = local_40;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_58);
  return;
}

Assistant:

void set_callback(const std::string& name, const std::string& alternative, std::function<T(CallbackArgs&)> callback, const std::string& description = "", bool dominant = false) {
			auto command = new CmdFunction<T> { name, alternative, description, false, dominant };
			command->callback = callback;
			_commands.push_back(command);
		}